

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashSet_BitfieldArgument_Test::
ParallelFlatHashSet_BitfieldArgument_Test(ParallelFlatHashSet_BitfieldArgument_Test *this)

{
  ParallelFlatHashSet_BitfieldArgument_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ParallelFlatHashSet_BitfieldArgument_Test_00346e48;
  return;
}

Assistant:

TEST(THIS_TEST_NAME, BitfieldArgument) {
  union {
    int n : 1;
  };
  n = 0;
  phmap::THIS_HASH_SET<int> s = {n};
  s.insert(n);
  s.insert(s.end(), n);
  s.insert({n});
  s.erase(n);
  s.count(n);
  s.prefetch(n);
  s.find(n);
  s.contains(n);
  s.equal_range(n);
}